

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::InternReadFile
          (Discreet3DSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pMVar1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *pDVar3;
  pointer sMesh;
  allocator<char> local_1e9;
  string local_1e8;
  Scene _scene;
  StreamReaderLE stream;
  Node _rootNode;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_rootNode,"rb",(allocator<char> *)&_scene);
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,_rootNode.mParent);
  StreamReader<false,_false>::StreamReader(&stream,(IOStream *)CONCAT44(extraout_var,iVar2),false);
  std::__cxx11::string::~string((string *)&_rootNode);
  if (((int)stream.end - (int)stream.current & 0xfffffff0U) == 0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_rootNode,
                   "3DS file is either empty or corrupt: ",pFile);
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)&_rootNode);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this->stream = &stream;
  _scene.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _scene.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _scene.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _scene.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _scene.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _scene.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _scene.mMeshes.super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  _scene.mMeshes.super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _scene.mMaterials.
  super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _scene.mMeshes.super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  _scene.mMaterials.
  super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _scene.mMaterials.
  super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->mScene = &_scene;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"UNNAMED",&local_1e9);
  D3DS::Node::Node(&_rootNode,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  this->mLastNodeIndex = -1;
  this->mCurrentNode = &_rootNode;
  this->mRootNode = &_rootNode;
  _rootNode.mHierarchyPos = -1;
  _rootNode.mHierarchyIndex = -1;
  _rootNode.mParent = (Node *)0x0;
  this->mMasterScale = 1.0;
  std::__cxx11::string::assign((char *)&this->mBackgroundImage);
  this->bHasBG = false;
  this->bIsPrj = false;
  ParseMainChunk(this);
  sMesh = (this->mScene->mMeshes).
          super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
          super__Vector_impl_data._M_start;
  pMVar1 = (this->mScene->mMeshes).
           super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (sMesh == pMVar1) {
      ReplaceDefaultMaterial(this);
      ConvertScene(this,pScene);
      GenerateNodeGraph(this,pScene);
      ApplyMasterScale(this,pScene);
      this->stream = (StreamReaderLE *)0x0;
      this->mRootNode = (Node *)0x0;
      this->mScene = (Scene *)0x0;
      D3DS::Node::~Node(&_rootNode);
      D3DS::Scene::~Scene(&_scene);
      StreamReader<false,_false>::~StreamReader(&stream);
      return;
    }
    if (((sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       ((sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start)) break;
    CheckIndices(this,sMesh);
    MakeUnique(this,sMesh);
    ComputeNormalsWithSmoothingsGroups<Assimp::D3DS::Face>
              (&sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>);
    sMesh = sMesh + 1;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1e8,"3DS file contains faces but no vertices: ",pFile);
  DeadlyImportError::DeadlyImportError(pDVar3,&local_1e8);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Discreet3DSImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16) {
        throw DeadlyImportError("3DS file is either empty or corrupt: " + pFile);
    }
    this->stream = &stream;

    // Allocate our temporary 3DS representation
    D3DS::Scene _scene;
    mScene = &_scene;

    // Initialize members
    D3DS::Node _rootNode("UNNAMED");
    mLastNodeIndex             = -1;
    mCurrentNode               = &_rootNode;
    mRootNode                  = mCurrentNode;
    mRootNode->mHierarchyPos   = -1;
    mRootNode->mHierarchyIndex = -1;
    mRootNode->mParent         = NULL;
    mMasterScale               = 1.0f;
    mBackgroundImage           = "";
    bHasBG                     = false;
    bIsPrj                     = false;

    // Parse the file
    ParseMainChunk();

    // Process all meshes in the file. First check whether all
    // face indices have valid values. The generate our
    // internal verbose representation. Finally compute normal
    // vectors from the smoothing groups we read from the
    // file.
    for (auto &mesh : mScene->mMeshes) {
        if (mesh.mFaces.size() > 0 && mesh.mPositions.size() == 0)  {
            throw DeadlyImportError("3DS file contains faces but no vertices: " + pFile);
        }
        CheckIndices(mesh);
        MakeUnique  (mesh);
        ComputeNormalsWithSmoothingsGroups<D3DS::Face>(mesh);
    }

    // Replace all occurences of the default material with a
    // valid material. Generate it if no material containing
    // DEFAULT in its name has been found in the file
    ReplaceDefaultMaterial();

    // Convert the scene from our internal representation to an
    // aiScene object. This involves copying all meshes, lights
    // and cameras to the scene
    ConvertScene(pScene);

    // Generate the node graph for the scene. This is a little bit
    // tricky since we'll need to split some meshes into sub-meshes
    GenerateNodeGraph(pScene);

    // Now apply the master scaling factor to the scene
    ApplyMasterScale(pScene);

    // Our internal scene representation and the root
    // node will be automatically deleted, so the whole hierarchy will follow

    AI_DEBUG_INVALIDATE_PTR(mRootNode);
    AI_DEBUG_INVALIDATE_PTR(mScene);
    AI_DEBUG_INVALIDATE_PTR(this->stream);
}